

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::equal(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
        *this,merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
              *that)

{
  bool bVar1;
  merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
  *that_local;
  merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  bVar1 = __gnu_cxx::operator==(&this->m_begin,&that->m_begin);
  if (!bVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/merge_iterator.hpp"
                  ,0x94,
                  "bool burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::equal(const merge_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                 );
  }
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>>
                    ((this->m_begin)._M_current,(this->m_end)._M_current,(that->m_begin)._M_current,
                     (that->m_end)._M_current);
  return bVar1;
}

Assistant:

bool equal (const merge_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }